

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

bool llb_buildsystem_command_interface_spawn
               (llb_task_interface_t ti,llb_buildsystem_queue_job_context_t *job_context,char **args
               ,int32_t arg_count,char **env_keys,char **env_values,int32_t env_count,
               llb_data_t *working_dir,llb_buildsystem_spawn_delegate_t *delegate)

{
  char *__s;
  char *__s_00;
  ProcessAttributes attributes;
  ProcessStatus PVar1;
  size_t sVar2;
  ProcessDelegate *delegate_00;
  ulong uVar3;
  ArrayRef<llvm::StringRef> commandLine;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment;
  future<llbuild::basic::ProcessResult> result;
  promise<llbuild::basic::ProcessResult> p;
  ProcessResult local_128;
  pair<llvm::StringRef,_llvm::StringRef> *local_f8;
  iterator iStack_f0;
  pair<llvm::StringRef,_llvm::StringRef> *local_e8;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_d8;
  llb_buildsystem_queue_job_context_t *local_c0;
  undefined2 local_b8;
  undefined6 uStack_b6;
  uint8_t *puStack_b0;
  uint64_t local_a8;
  undefined2 uStack_a0;
  undefined6 uStack_9e;
  TaskInterface local_98;
  __basic_future<llbuild::basic::ProcessResult> local_88;
  undefined1 local_78 [24];
  code *local_60;
  bool local_58;
  promise<llbuild::basic::ProcessResult> local_48;
  
  local_98.ctx = ti.ctx;
  local_98.impl = ti.impl;
  local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (StringRef *)0x0;
  local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (StringRef *)0x0;
  local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (StringRef *)0x0;
  local_c0 = job_context;
  if (0 < arg_count) {
    uVar3 = 0;
    do {
      local_128._0_8_ = args[uVar3];
      if ((char *)local_128._0_8_ == (char *)0x0) {
        local_128._8_8_ = 0;
      }
      else {
        local_128._8_8_ = strlen((char *)local_128._0_8_);
      }
      if (local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>
                  (&local_d8,
                   (iterator)
                   local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(StringRef *)&local_128);
      }
      else {
        (local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
         super__Vector_impl_data._M_finish)->Data = (char *)local_128._0_8_;
        (local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
         super__Vector_impl_data._M_finish)->Length = local_128._8_8_;
        local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)arg_count != uVar3);
  }
  local_f8 = (pair<llvm::StringRef,_llvm::StringRef> *)0x0;
  iStack_f0._M_current = (pair<llvm::StringRef,_llvm::StringRef> *)0x0;
  local_e8 = (pair<llvm::StringRef,_llvm::StringRef> *)0x0;
  if (0 < env_count) {
    uVar3 = 0;
    do {
      __s = env_keys[uVar3];
      if (__s == (char *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = strlen(__s);
      }
      __s_00 = env_values[uVar3];
      if (__s_00 == (char *)0x0) {
        local_128.stime = 0;
      }
      else {
        local_128.stime = strlen(__s_00);
      }
      local_128._0_8_ = __s;
      local_128._8_8_ = sVar2;
      local_128.utime = (uint64_t)__s_00;
      if (iStack_f0._M_current == local_e8) {
        std::
        vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
        ::_M_realloc_insert<std::pair<llvm::StringRef,llvm::StringRef>>
                  ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                    *)&local_f8,iStack_f0,(pair<llvm::StringRef,_llvm::StringRef> *)&local_128);
      }
      else {
        ((iStack_f0._M_current)->second).Data = __s_00;
        ((iStack_f0._M_current)->second).Length = local_128.stime;
        ((iStack_f0._M_current)->first).Data = __s;
        ((iStack_f0._M_current)->first).Length = sVar2;
        iStack_f0._M_current = iStack_f0._M_current + 1;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)env_count != uVar3);
  }
  std::promise<llbuild::basic::ProcessResult>::promise(&local_48);
  std::__basic_future<llbuild::basic::ProcessResult>::__basic_future(&local_88,&local_48._M_future);
  delegate_00 = (ProcessDelegate *)operator_new(0x10);
  delegate_00->_vptr_ProcessDelegate = (_func_int **)&PTR__ProcessDelegate_00242230;
  delegate_00[1]._vptr_ProcessDelegate = (_func_int **)delegate;
  commandLine.Length =
       (long)local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  environment.Length = (long)iStack_f0._M_current - (long)local_f8 >> 5;
  local_b8 = 1;
  local_a8 = working_dir->length;
  puStack_b0 = working_dir->data;
  uStack_a0 = 0x101;
  local_128.pid = 0;
  local_128._12_4_ = 0;
  local_128.utime = 0;
  local_128.stime = 0;
  local_58 = true;
  local_60 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1400:30)>
             ::_M_invoke;
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_78._16_8_ =
       std::
       _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1400:30)>
       ::_M_manager;
  attributes._2_6_ = uStack_b6;
  attributes.canSafelyInterrupt = true;
  attributes.connectToConsole = false;
  attributes._26_6_ = uStack_9e;
  attributes.inheritEnvironment = true;
  attributes.controlEnabled = true;
  attributes.workingDir.Data = (char *)puStack_b0;
  attributes.workingDir.Length = local_a8;
  commandLine.Data =
       local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
       super__Vector_impl_data._M_start;
  environment.Data = local_f8;
  local_128._0_8_ = &local_48;
  local_78._0_8_ = &local_48;
  llbuild::core::TaskInterface::spawn
            (&local_98,(QueueJobContext *)local_c0,commandLine,environment,attributes,
             (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)local_78,delegate_00)
  ;
  if (local_58 == true) {
    if ((code *)local_78._16_8_ != (code *)0x0) {
      (*(code *)local_78._16_8_)(local_78,local_78,3);
    }
    local_58 = false;
  }
  if ((code *)local_128.utime != (code *)0x0) {
    (*(code *)local_128.utime)(&local_128,&local_128,3);
  }
  (*delegate_00->_vptr_ProcessDelegate[1])(delegate_00);
  std::future<llbuild::basic::ProcessResult>::get
            (&local_128,(future<llbuild::basic::ProcessResult> *)&local_88);
  PVar1 = local_128.status;
  if (local_88._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<llbuild::basic::ProcessResult>::~promise(&local_48);
  if (local_f8 != (pair<llvm::StringRef,_llvm::StringRef> *)0x0) {
    operator_delete(local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start != (StringRef *)0x0) {
    operator_delete(local_d8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return PVar1 == Succeeded;
}

Assistant:

bool llb_buildsystem_command_interface_spawn(llb_task_interface_t ti, llb_buildsystem_queue_job_context_t *job_context, const char * const*args, int32_t arg_count, const char * const *env_keys, const char * const *env_values, int32_t env_count, llb_data_t *working_dir, llb_buildsystem_spawn_delegate_t *delegate) {
  auto coreti = reinterpret_cast<core::TaskInterface*>(&ti);
  auto arguments = std::vector<StringRef>();
  for (int32_t i = 0; i < arg_count; i++) {
    arguments.push_back(StringRef(args[i]));
  }
  auto environment = std::vector<std::pair<StringRef, StringRef>>();
  for (int32_t i = 0; i < env_count; i++) {
    environment.push_back(std::pair<StringRef, StringRef>(StringRef(env_keys[i]), StringRef(env_values[i])));
  }
  
  std::promise<ProcessResult> p;
  auto result = p.get_future();
  auto commandCompletionFn = [&p](ProcessResult processResult) mutable {
    p.set_value(processResult);
  };
  
  class ForwardingProcessDelegate: public basic::ProcessDelegate {
    llb_buildsystem_spawn_delegate_t *delegate;
    
  public:
    ForwardingProcessDelegate(llb_buildsystem_spawn_delegate_t *delegate): delegate(delegate) {}
    
    virtual void processStarted(ProcessContext* ctx, ProcessHandle handle,
                                llbuild_pid_t pid) {
      if (delegate != NULL) {
        delegate->process_started(delegate->context, pid);
      }
    }

    virtual void processHadError(ProcessContext* ctx, ProcessHandle handle,
                                 const Twine& message) {
      if (delegate != NULL) {
        auto errStr = message.str();
        llb_data_t err{ errStr.size(), (const uint8_t*) errStr.data() };
        delegate->process_had_error(delegate->context, &err);
      }
    };

    virtual void processHadOutput(ProcessContext* ctx, ProcessHandle handle,
                                  StringRef data) {
      if (delegate != NULL) {
        llb_data_t message{ data.size(), (const uint8_t*) data.data() };
        delegate->process_had_output(delegate->context, &message);
      }
    };

    virtual void processFinished(ProcessContext* ctx, ProcessHandle handle,
                                 const ProcessResult& result) {
      if (delegate != NULL) {
        llb_buildsystem_command_extended_result_t res;
        res.result = get_command_result(result.status);
        res.exit_status = result.exitCode;
        res.pid = result.pid;
        res.utime = result.utime;
        res.stime = result.stime;
        res.maxrss = result.maxrss;
        delegate->process_finished(delegate->context, &res);
      }
    }

  };

  auto forwardingDelegate = new ForwardingProcessDelegate(delegate);
  coreti->spawn((QueueJobContext*)job_context, ArrayRef<StringRef>(arguments), ArrayRef<std::pair<StringRef, StringRef>>(environment), {true, false, StringRef((const char*)working_dir->data, working_dir->length)}, {commandCompletionFn}, forwardingDelegate);

  delete forwardingDelegate;

  return result.get().status == ProcessStatus::Succeeded;  
}